

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS
ref_node_tri_grad_nodes(REF_NODE ref_node,REF_INT *nodes,REF_DBL *scalar,REF_DBL *gradient)

{
  REF_DBL RVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  REF_DBL *pRVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  REF_DBL norm02 [3];
  REF_DBL edge01 [3];
  REF_DBL edge02 [3];
  REF_DBL norm01 [3];
  REF_DBL grad2 [3];
  REF_DBL grad1 [3];
  double local_138 [4];
  double local_118 [4];
  double local_f8 [4];
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8 [4];
  REF_DBL local_88 [4];
  REF_DBL local_68 [4];
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  
  *gradient = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;
  uVar7 = ref_node_tri_area(ref_node,nodes,&local_b0);
  if (uVar7 == 0) {
    local_38 = local_b0 + local_b0;
    pRVar5 = ref_node->real;
    iVar2 = nodes[1];
    iVar3 = *nodes;
    lVar9 = 0;
    do {
      local_118[lVar9] = pRVar5[(long)iVar2 * 0xf + lVar9] - pRVar5[(long)iVar3 * 0xf + lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    uStack_30 = 0;
    iVar2 = nodes[2];
    lVar9 = 0;
    do {
      local_f8[lVar9] = pRVar5[(long)iVar2 * 0xf + lVar9] - pRVar5[(long)iVar3 * 0xf + lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    local_a8[2] = local_118[2];
    local_a8[0] = local_118[0];
    local_a8[1] = local_118[1];
    local_138[0] = local_f8[0];
    local_138[1] = local_f8[1];
    local_138[2] = local_f8[2];
    uVar7 = ref_math_normalize(local_a8);
    if (uVar7 == 0) {
      uVar7 = ref_math_normalize(local_138);
      if (uVar7 == 0) {
        local_c0 = local_118[1];
        local_b8 = local_118[0];
        local_d0 = local_f8[1];
        local_c8 = local_f8[0];
        local_48 = local_f8[2];
        uStack_40 = 0;
        local_d8 = local_f8[2] * local_f8[2] + local_f8[0] * local_f8[0] + local_f8[1] * local_f8[1]
        ;
        lVar9 = 0;
        do {
          local_68[lVar9] =
               local_138[lVar9] *
               -(local_138[2] * local_118[2] +
                local_138[0] * local_118[0] + local_138[1] * local_118[1]) + local_118[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        uVar7 = ref_math_normalize(local_68);
        if (uVar7 == 0) {
          lVar9 = 0;
          do {
            local_68[lVar9] = local_68[lVar9] * SQRT(local_d8);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          dVar11 = local_c0 * local_c0;
          dVar13 = local_b8 * local_b8;
          lVar9 = 0;
          do {
            local_88[lVar9] =
                 local_a8[lVar9] *
                 -(local_48 * local_a8[2] + local_c8 * local_a8[0] + local_d0 * local_a8[1]) +
                 local_f8[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          uVar7 = ref_math_normalize(local_88);
          if (uVar7 == 0) {
            lVar9 = 0;
            do {
              local_88[lVar9] =
                   local_88[lVar9] * SQRT(local_118[2] * local_118[2] + dVar13 + dVar11);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            iVar2 = nodes[1];
            iVar3 = *nodes;
            iVar4 = nodes[2];
            lVar9 = 0;
            do {
              gradient[lVar9] =
                   (scalar[iVar2] - scalar[iVar3]) * local_68[lVar9] +
                   (scalar[iVar4] - scalar[iVar3]) * local_88[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            auVar14._0_8_ = local_38 * 1e+20;
            RVar1 = *gradient;
            auVar14._8_8_ = RVar1;
            auVar15._8_8_ = -RVar1;
            auVar15._0_8_ = -auVar14._0_8_;
            auVar15 = maxpd(auVar14,auVar15);
            dVar11 = auVar15._0_8_;
            if (auVar15._8_8_ < dVar11) {
              dVar13 = gradient[1];
              dVar16 = dVar13;
              if (dVar13 <= -dVar13) {
                dVar16 = -dVar13;
              }
              if (dVar16 < dVar11) {
                dVar16 = gradient[2];
                dVar17 = dVar16;
                if (dVar16 <= -dVar16) {
                  dVar17 = -dVar16;
                }
                if (dVar17 < dVar11) {
                  auVar12._8_8_ = dVar13;
                  auVar12._0_8_ = RVar1;
                  auVar6._8_8_ = local_38;
                  auVar6._0_8_ = local_38;
                  auVar15 = divpd(auVar12,auVar6);
                  *(undefined1 (*) [16])gradient = auVar15;
                  gradient[2] = dVar16 / local_38;
                  return 0;
                }
              }
            }
            *gradient = 0.0;
            gradient[1] = 0.0;
            gradient[2] = 0.0;
            return 4;
          }
          pcVar10 = "normalize zero length grad2";
          uVar8 = 0xcea;
        }
        else {
          pcVar10 = "normalize zero length grad1";
          uVar8 = 0xce4;
        }
      }
      else {
        pcVar10 = "normalize zero length n0 -> n2";
        uVar8 = 0xcdf;
      }
    }
    else {
      pcVar10 = "normalize zero length n0 -> n1";
      uVar8 = 0xcde;
    }
  }
  else {
    pcVar10 = "area";
    uVar8 = 0xcd2;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar8,
         "ref_node_tri_grad_nodes",(ulong)uVar7,pcVar10);
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_grad_nodes(REF_NODE ref_node, REF_INT *nodes,
                                           REF_DBL *scalar, REF_DBL *gradient) {
  REF_DBL area2, dot, side_length;
  REF_DBL grad1[3], grad2[3], edge02[3], edge01[3], norm02[3], norm01[3];
  REF_INT i;
  gradient[0] = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;

  RSS(ref_node_tri_area(ref_node, nodes, &area2), "area");
  area2 *= 2;

  for (i = 0; i < 3; i++)
    edge01[i] = ref_node_xyz(ref_node, i, nodes[1]) -
                ref_node_xyz(ref_node, i, nodes[0]);
  for (i = 0; i < 3; i++)
    edge02[i] = ref_node_xyz(ref_node, i, nodes[2]) -
                ref_node_xyz(ref_node, i, nodes[0]);

  for (i = 0; i < 3; i++) norm01[i] = edge01[i];
  for (i = 0; i < 3; i++) norm02[i] = edge02[i];
  RSS(ref_math_normalize(norm01), "normalize zero length n0 -> n1");
  RSS(ref_math_normalize(norm02), "normalize zero length n0 -> n2");

  dot = ref_math_dot(edge01, norm02);
  side_length = sqrt(ref_math_dot(edge02, edge02));
  for (i = 0; i < 3; i++) grad1[i] = edge01[i] - dot * norm02[i];
  RSS(ref_math_normalize(grad1), "normalize zero length grad1");
  for (i = 0; i < 3; i++) grad1[i] *= side_length;

  dot = ref_math_dot(edge02, norm01);
  side_length = sqrt(ref_math_dot(edge01, edge01));
  for (i = 0; i < 3; i++) grad2[i] = edge02[i] - dot * norm01[i];
  RSS(ref_math_normalize(grad2), "normalize zero length grad2");
  for (i = 0; i < 3; i++) grad2[i] *= side_length;

  for (i = 0; i < 3; i++)
    gradient[i] = (scalar[nodes[1]] - scalar[nodes[0]]) * grad1[i] +
                  (scalar[nodes[2]] - scalar[nodes[0]]) * grad2[i];

  if (ref_math_divisible(gradient[0], area2) &&
      ref_math_divisible(gradient[1], area2) &&
      ref_math_divisible(gradient[2], area2)) {
    gradient[0] /= area2;
    gradient[1] /= area2;
    gradient[2] /= area2;
  } else {
    gradient[0] = 0.0;
    gradient[1] = 0.0;
    gradient[2] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}